

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ClassBuilder.cpp
# Opt level: O2

ClassBuilder * __thiscall
Lodtalk::ClassBuilder::addClassMethod(ClassBuilder *this,char *name,PrimitiveFunction primitive)

{
  mapped_type *pp_Var1;
  allocator local_39;
  key_type local_38;
  
  std::__cxx11::string::string((string *)&local_38,name,&local_39);
  pp_Var1 = std::__detail::
            _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int_(*)(Lodtalk::InterpreterProxy_*)>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int_(*)(Lodtalk::InterpreterProxy_*)>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
            ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int_(*)(Lodtalk::InterpreterProxy_*)>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int_(*)(Lodtalk::InterpreterProxy_*)>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                          *)&this->classSidePrimitiveMethods,&local_38);
  *pp_Var1 = primitive;
  std::__cxx11::string::~string((string *)&local_38);
  return this;
}

Assistant:

ClassBuilder &ClassBuilder::addClassMethod(const char *name, PrimitiveFunction primitive)
{
    classSidePrimitiveMethods[name] = primitive;
    return *this;
}